

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O0

void Ivy_ManHaigTrasfer(Ivy_Man_t *p,Ivy_Man_t *pNew)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Obj_t *pIVar3;
  void *pvVar4;
  int local_24;
  int i;
  Ivy_Obj_t *pObj;
  Ivy_Man_t *pNew_local;
  Ivy_Man_t *p_local;
  
  if (p->pHaig == (Ivy_Man_t *)0x0) {
    __assert_fail("p->pHaig != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyHaig.c"
                  ,0x8d,"void Ivy_ManHaigTrasfer(Ivy_Man_t *, Ivy_Man_t *)");
  }
  pIVar2 = Ivy_ManConst1(p);
  pIVar2 = pIVar2->pEquiv;
  pIVar3 = Ivy_ManConst1(pNew);
  pIVar3->pEquiv = pIVar2;
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNew->vPis), local_24 < iVar1; local_24 = local_24 + 1) {
    pvVar4 = Vec_PtrEntry(pNew->vPis,local_24);
    pIVar2 = Ivy_ManPi(p,local_24);
    *(Ivy_Obj_t **)((long)pvVar4 + 0x48) = pIVar2->pEquiv;
  }
  pNew->pHaig = p->pHaig;
  return;
}

Assistant:

void Ivy_ManHaigTrasfer( Ivy_Man_t * p, Ivy_Man_t * pNew )
{
    Ivy_Obj_t * pObj;
    int i;
    assert( p->pHaig != NULL );
    Ivy_ManConst1(pNew)->pEquiv = Ivy_ManConst1(p)->pEquiv;
    Ivy_ManForEachPi( pNew, pObj, i )
        pObj->pEquiv = Ivy_ManPi( p, i )->pEquiv;
    pNew->pHaig = p->pHaig;
}